

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O3

void __thiscall
cmake::GetRegisteredGenerators
          (cmake *this,
          vector<cmake::GeneratorInfo,_std::allocator<cmake::GeneratorInfo>_> *generators)

{
  int iVar1;
  cmExternalMakefileProjectGeneratorFactory *pcVar2;
  pointer ppcVar3;
  ulong uVar4;
  pointer ppcVar5;
  pointer pbVar6;
  GeneratorInfo info;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  names;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  genList;
  undefined1 local_110 [32];
  _Alloc_hider local_f0;
  size_type local_e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e0;
  _Alloc_hider local_d0;
  size_type local_c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c0;
  undefined2 local_b0;
  bool local_ae;
  string local_a8;
  pointer local_80;
  vector<cmake::GeneratorInfo,_std::allocator<cmake::GeneratorInfo>_> *local_78;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_70;
  cmake *local_58;
  string local_50;
  
  ppcVar3 = (this->Generators).
            super__Vector_base<cmGlobalGeneratorFactory_*,_std::allocator<cmGlobalGeneratorFactory_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  local_80 = (pointer)(this->Generators).
                      super__Vector_base<cmGlobalGeneratorFactory_*,_std::allocator<cmGlobalGeneratorFactory_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
  local_78 = generators;
  local_58 = this;
  if ((pointer)ppcVar3 != local_80) {
    do {
      local_a8._M_dataplus._M_p = (pointer)0x0;
      local_a8._M_string_length = 0;
      local_a8.field_2._M_allocated_capacity = 0;
      (*(*ppcVar3)->_vptr_cmGlobalGeneratorFactory[4])(*ppcVar3,&local_a8);
      if ((pointer)local_a8._M_string_length != local_a8._M_dataplus._M_p) {
        uVar4 = 0;
        do {
          local_110._0_8_ = local_110 + 0x10;
          local_110._8_8_ = 0;
          local_110[0x10] = '\0';
          local_f0._M_p = (pointer)&local_e0;
          local_e8 = 0;
          local_e0._M_local_buf[0] = '\0';
          local_c8 = 0;
          local_c0._M_local_buf[0] = '\0';
          local_d0._M_p = (pointer)&local_c0;
          iVar1 = (*(*ppcVar3)->_vptr_cmGlobalGeneratorFactory[5])();
          local_b0._0_1_ = SUB41(iVar1,0);
          iVar1 = (*(*ppcVar3)->_vptr_cmGlobalGeneratorFactory[6])();
          local_b0._1_1_ = SUB41(iVar1,0);
          std::__cxx11::string::_M_assign((string *)local_110);
          std::__cxx11::string::_M_assign((string *)&local_f0);
          local_ae = false;
          std::vector<cmake::GeneratorInfo,_std::allocator<cmake::GeneratorInfo>_>::push_back
                    (local_78,(value_type *)local_110);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_d0._M_p != &local_c0) {
            operator_delete(local_d0._M_p,
                            CONCAT71(local_c0._M_allocated_capacity._1_7_,local_c0._M_local_buf[0])
                            + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_f0._M_p != &local_e0) {
            operator_delete(local_f0._M_p,
                            CONCAT71(local_e0._M_allocated_capacity._1_7_,local_e0._M_local_buf[0])
                            + 1);
          }
          if ((undefined1 *)local_110._0_8_ != local_110 + 0x10) {
            operator_delete((void *)local_110._0_8_,CONCAT71(local_110._17_7_,local_110[0x10]) + 1);
          }
          uVar4 = uVar4 + 1;
        } while (uVar4 < (ulong)((long)(local_a8._M_string_length - (long)local_a8._M_dataplus._M_p)
                                >> 5));
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_a8);
      ppcVar3 = ppcVar3 + 1;
    } while ((pointer)ppcVar3 != local_80);
  }
  ppcVar5 = (local_58->ExtraGenerators).
            super__Vector_base<cmExternalMakefileProjectGeneratorFactory_*,_std::allocator<cmExternalMakefileProjectGeneratorFactory_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  local_80 = (local_58->ExtraGenerators).
             super__Vector_base<cmExternalMakefileProjectGeneratorFactory_*,_std::allocator<cmExternalMakefileProjectGeneratorFactory_*>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  if (ppcVar5 != local_80) {
    do {
      cmExternalMakefileProjectGeneratorFactory::GetSupportedGlobalGenerators_abi_cxx11_
                (&local_70,*ppcVar5);
      for (pbVar6 = local_70.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          pbVar6 != local_70.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish; pbVar6 = pbVar6 + 1) {
        local_110._0_8_ = local_110 + 0x10;
        local_110._8_8_ = 0;
        local_110[0x10] = '\0';
        local_f0._M_p = (pointer)&local_e0;
        local_e8 = 0;
        local_e0._M_local_buf[0] = '\0';
        local_d0._M_p = (pointer)&local_c0;
        local_c8 = 0;
        local_c0._M_local_buf[0] = '\0';
        cmExternalMakefileProjectGeneratorFactory::GetName_abi_cxx11_(&local_50,*ppcVar5);
        cmExternalMakefileProjectGenerator::CreateFullGeneratorName(&local_a8,pbVar6,&local_50);
        std::__cxx11::string::operator=((string *)local_110,(string *)&local_a8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
          operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
        std::__cxx11::string::_M_assign((string *)&local_f0);
        cmExternalMakefileProjectGeneratorFactory::GetName_abi_cxx11_(&local_a8,*ppcVar5);
        std::__cxx11::string::operator=((string *)&local_d0,(string *)&local_a8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
          operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
        }
        local_b0._0_1_ = false;
        local_b0._1_1_ = false;
        local_ae = false;
        std::vector<cmake::GeneratorInfo,_std::allocator<cmake::GeneratorInfo>_>::push_back
                  (local_78,(value_type *)local_110);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d0._M_p != &local_c0) {
          operator_delete(local_d0._M_p,
                          CONCAT71(local_c0._M_allocated_capacity._1_7_,local_c0._M_local_buf[0]) +
                          1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f0._M_p != &local_e0) {
          operator_delete(local_f0._M_p,
                          CONCAT71(local_e0._M_allocated_capacity._1_7_,local_e0._M_local_buf[0]) +
                          1);
        }
        if ((undefined1 *)local_110._0_8_ != local_110 + 0x10) {
          operator_delete((void *)local_110._0_8_,CONCAT71(local_110._17_7_,local_110[0x10]) + 1);
        }
      }
      pcVar2 = *ppcVar5;
      for (pbVar6 = (pcVar2->Aliases).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          pbVar6 != (pcVar2->Aliases).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish; pbVar6 = pbVar6 + 1) {
        local_110._0_8_ = local_110 + 0x10;
        local_110._8_8_ = 0;
        local_110[0x10] = '\0';
        local_f0._M_p = (pointer)&local_e0;
        local_e8 = 0;
        local_e0._M_local_buf[0] = '\0';
        local_d0._M_p = (pointer)&local_c0;
        local_c8 = 0;
        local_c0._M_local_buf[0] = '\0';
        std::__cxx11::string::_M_assign((string *)local_110);
        if (local_70.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start !=
            local_70.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          std::__cxx11::string::_M_assign((string *)&local_f0);
        }
        cmExternalMakefileProjectGeneratorFactory::GetName_abi_cxx11_(&local_a8,*ppcVar5);
        std::__cxx11::string::operator=((string *)&local_d0,(string *)&local_a8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
          operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
        }
        local_b0._0_1_ = false;
        local_b0._1_1_ = false;
        local_ae = true;
        std::vector<cmake::GeneratorInfo,_std::allocator<cmake::GeneratorInfo>_>::push_back
                  (local_78,(value_type *)local_110);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d0._M_p != &local_c0) {
          operator_delete(local_d0._M_p,
                          CONCAT71(local_c0._M_allocated_capacity._1_7_,local_c0._M_local_buf[0]) +
                          1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f0._M_p != &local_e0) {
          operator_delete(local_f0._M_p,
                          CONCAT71(local_e0._M_allocated_capacity._1_7_,local_e0._M_local_buf[0]) +
                          1);
        }
        if ((undefined1 *)local_110._0_8_ != local_110 + 0x10) {
          operator_delete((void *)local_110._0_8_,CONCAT71(local_110._17_7_,local_110[0x10]) + 1);
        }
        pcVar2 = *ppcVar5;
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_70);
      ppcVar5 = ppcVar5 + 1;
    } while (ppcVar5 != local_80);
  }
  return;
}

Assistant:

void cmake::GetRegisteredGenerators(
  std::vector<GeneratorInfo>& generators) const
{
  for (RegisteredGeneratorsVector::const_iterator i = this->Generators.begin(),
                                                  e = this->Generators.end();
       i != e; ++i) {
    std::vector<std::string> names;
    (*i)->GetGenerators(names);

    for (size_t j = 0; j < names.size(); ++j) {
      GeneratorInfo info;
      info.supportsToolset = (*i)->SupportsToolset();
      info.supportsPlatform = (*i)->SupportsPlatform();
      info.name = names[j];
      info.baseName = names[j];
      info.isAlias = false;
      generators.push_back(info);
    }
  }

  for (RegisteredExtraGeneratorsVector::const_iterator
         i = this->ExtraGenerators.begin(),
         e = this->ExtraGenerators.end();
       i != e; ++i) {
    const std::vector<std::string> genList =
      (*i)->GetSupportedGlobalGenerators();
    for (std::vector<std::string>::const_iterator gen = genList.begin();
         gen != genList.end(); ++gen) {
      GeneratorInfo info;
      info.name = cmExternalMakefileProjectGenerator::CreateFullGeneratorName(
        *gen, (*i)->GetName());
      info.baseName = *gen;
      info.extraName = (*i)->GetName();
      info.supportsPlatform = false;
      info.supportsToolset = false;
      info.isAlias = false;
      generators.push_back(info);
    }
    for (std::vector<std::string>::const_iterator a = (*i)->Aliases.begin();
         a != (*i)->Aliases.end(); ++a) {
      GeneratorInfo info;
      info.name = *a;
      if (!genList.empty()) {
        info.baseName = genList.at(0);
      }
      info.extraName = (*i)->GetName();
      info.supportsPlatform = false;
      info.supportsToolset = false;
      info.isAlias = true;
      generators.push_back(info);
    }
  }
}